

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O1

void __thiscall MidiPlayerDialog::on_saveListButton_clicked(MidiPlayerDialog *this)

{
  int *piVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  char cVar5;
  undefined4 uVar6;
  int iVar7;
  Master *this_00;
  QSettings *pQVar8;
  long *plVar9;
  QTextStream *pQVar10;
  int iVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QFile listFile;
  QString fileName;
  QTextStream listStream;
  QArrayData *local_b8;
  char16_t *pcStack_b0;
  long local_a8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  qsizetype local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  QTextStream local_38 [16];
  
  if (on_saveListButton_clicked()::currentDir == '\0') {
    iVar11 = __cxa_guard_acquire(&on_saveListButton_clicked()::currentDir);
    if (iVar11 != 0) {
      QString::QString(&on_saveListButton_clicked::currentDir,(char *)0x0);
      __cxa_atexit(QString::~QString,&on_saveListButton_clicked::currentDir,&__dso_handle);
      __cxa_guard_release(&on_saveListButton_clicked()::currentDir);
    }
  }
  this_00 = Master::getInstance();
  pQVar8 = Master::getSettings(this_00);
  QVar12.m_data = (storage_type *)0x19;
  QVar12.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar12);
  local_b8 = (QArrayData *)local_58.shared;
  pcStack_b0 = (char16_t *)local_58._8_8_;
  local_a8 = local_58._16_8_;
  QVariant::QVariant((QVariant *)&local_58,0);
  QSettings::value((QString *)local_98.data,(QVariant *)pQVar8);
  uVar6 = QVariant::toInt((bool *)local_98.data);
  QVariant::~QVariant((QVariant *)&local_98);
  QVariant::~QVariant((QVariant *)&local_58);
  if (local_b8 != (QArrayData *)0x0) {
    LOCK();
    (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8,2,8);
    }
  }
  QVar13.m_data = (storage_type *)0x0;
  QVar13.m_size = (qsizetype)&local_98;
  QString::fromUtf8(QVar13);
  local_b8 = (QArrayData *)local_98.shared;
  pcStack_b0 = (char16_t *)local_98._8_8_;
  local_a8 = local_98._16_8_;
  QVar14.m_data = (storage_type *)0x15;
  QVar14.m_size = (qsizetype)&local_98;
  QString::fromUtf8(QVar14);
  local_78 = local_98._0_4_;
  uStack_74 = local_98._4_4_;
  uStack_70 = local_98._8_4_;
  uStack_6c = local_98._12_4_;
  local_68 = local_98._16_8_;
  QFileDialog::getSaveFileName
            (&local_58,this,&local_b8,&on_saveListButton_clicked::currentDir,&local_78,0,uVar6);
  piVar1 = (int *)CONCAT44(uStack_74,local_78);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),2,8);
    }
  }
  if (local_b8 != (QArrayData *)0x0) {
    LOCK();
    (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8,2,8);
    }
  }
  if (local_58._16_8_ != 0) {
    QDir::QDir((QDir *)&local_b8,(QString *)local_58.data);
    QDir::absolutePath();
    qVar4 = on_saveListButton_clicked::currentDir.d.size;
    pcVar3 = on_saveListButton_clicked::currentDir.d.ptr;
    pDVar2 = on_saveListButton_clicked::currentDir.d.d;
    on_saveListButton_clicked::currentDir.d.d = (Data *)local_98.shared;
    local_98.shared = (PrivateShared *)pDVar2;
    on_saveListButton_clicked::currentDir.d.ptr = (char16_t *)local_98._8_8_;
    on_saveListButton_clicked::currentDir.d.size = local_98._16_8_;
    local_98._8_8_ = pcVar3;
    local_98._16_8_ = qVar4;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,8);
      }
    }
    QDir::~QDir((QDir *)&local_b8);
    QFile::QFile((QFile *)&local_78,(QString *)local_58.data);
    cVar5 = QFile::open(&local_78,2);
    if (cVar5 != '\0') {
      QTextStream::QTextStream(local_38,(QIODevice *)&local_78);
      iVar11 = 0;
      while( true ) {
        iVar7 = QListWidget::count();
        if (iVar7 <= iVar11) break;
        plVar9 = (long *)QListWidget::item((int)*(undefined8 *)(this->ui + 0x18));
        (**(code **)(*plVar9 + 0x18))(&local_98,plVar9,0);
        QVariant::toString();
        QVariant::~QVariant((QVariant *)&local_98);
        pQVar10 = (QTextStream *)QTextStream::operator<<(local_38,(QString *)&local_b8);
        Qt::endl(pQVar10);
        if (local_b8 != (QArrayData *)0x0) {
          LOCK();
          (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_b8,2,8);
          }
        }
        iVar11 = iVar11 + 1;
      }
      QTextStream::~QTextStream(local_38);
    }
    QFile::~QFile((QFile *)&local_78);
  }
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,8);
    }
  }
  return;
}

Assistant:

void MidiPlayerDialog::on_saveListButton_clicked() {
	static QString currentDir = NULL;
	QFileDialog::Options qFileDialogOptions = QFileDialog::Options(Master::getInstance()->getSettings()->value("Master/qFileDialogOptions", 0).toInt());
	QString fileName = QFileDialog::getSaveFileName(this, NULL, currentDir, "Play list files (*.*)",
		NULL, qFileDialogOptions);
	if (!fileName.isEmpty()) {
		currentDir = QDir(fileName).absolutePath();
		QFile listFile(fileName);
		if (!listFile.open(QIODevice::WriteOnly)) return;
		QTextStream listStream(&listFile);
		for (int i = 0; i < ui->playList->count(); i++) {
#if QT_VERSION >= QT_VERSION_CHECK(5, 15, 0)
			using Qt::endl;
#endif
			listStream << ui->playList->item(i)->text() << endl;
		}
	}
}